

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

int Curl_resolv(connectdata *conn,char *hostname,int port,_Bool allowDOH,Curl_dns_entry **entry)

{
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  int local_54;
  int st;
  int respwait;
  Curl_addrinfo *addr;
  int rc;
  CURLcode result;
  Curl_easy *data;
  Curl_dns_entry *dns;
  Curl_dns_entry **entry_local;
  _Bool allowDOH_local;
  char *pcStack_20;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  data = (Curl_easy *)0x0;
  _rc = conn->data;
  addr._0_4_ = 0xffffffff;
  *entry = (Curl_dns_entry *)0x0;
  dns = (Curl_dns_entry *)entry;
  entry_local._3_1_ = allowDOH;
  entry_local._4_4_ = port;
  pcStack_20 = hostname;
  hostname_local = (char *)conn;
  if (_rc->share != (Curl_share *)0x0) {
    Curl_share_lock(_rc,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  data = (Curl_easy *)fetch_addr((connectdata *)hostname_local,pcStack_20,entry_local._4_4_);
  if (data != (Curl_easy *)0x0) {
    Curl_infof(_rc,"Hostname %s was found in DNS cache\n",pcStack_20);
    data->conn = (connectdata *)((long)&data->conn->data + 1);
    addr._0_4_ = 0;
  }
  if (_rc->share != (Curl_share *)0x0) {
    Curl_share_unlock(_rc,CURL_LOCK_DATA_DNS);
  }
  if (data == (Curl_easy *)0x0) {
    local_54 = 0;
    _Var1 = Curl_ipvalid((connectdata *)hostname_local);
    if (!_Var1) {
      return -1;
    }
    if ((_rc->set).resolver_start != (curl_resolver_start_callback)0x0) {
      Curl_set_in_callback(_rc,true);
      iVar2 = (*(_rc->set).resolver_start)
                        ((_rc->state).resolver,(void *)0x0,(_rc->set).resolver_start_client);
      Curl_set_in_callback(_rc,false);
      if (iVar2 != 0) {
        return -1;
      }
    }
    if (((entry_local._3_1_ & 1) == 0) || ((*(ulong *)&(_rc->set).field_0x888 >> 0x37 & 1) == 0)) {
      _st = Curl_getaddrinfo((connectdata *)hostname_local,pcStack_20,entry_local._4_4_,&local_54);
    }
    else {
      _st = Curl_doh((connectdata *)hostname_local,pcStack_20,entry_local._4_4_,&local_54);
    }
    if (_st == (Curl_addrinfo *)0x0) {
      if (local_54 != 0) {
        CVar3 = Curl_resolv_check((connectdata *)hostname_local,(Curl_dns_entry **)&data);
        if (CVar3 != CURLE_OK) {
          return -1;
        }
        addr._0_4_ = (uint)(data == (Curl_easy *)0x0);
      }
    }
    else {
      if (_rc->share != (Curl_share *)0x0) {
        Curl_share_lock(_rc,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      data = (Curl_easy *)Curl_cache_addr(_rc,_st,pcStack_20,entry_local._4_4_);
      if (_rc->share != (Curl_share *)0x0) {
        Curl_share_unlock(_rc,CURL_LOCK_DATA_DNS);
      }
      if (data == (Curl_easy *)0x0) {
        Curl_freeaddrinfo(_st);
      }
      else {
        addr._0_4_ = 0;
      }
    }
  }
  dns->addr = (Curl_addrinfo *)data;
  return (uint)addr;
}

Assistant:

int Curl_resolv(struct connectdata *conn,
                const char *hostname,
                int port,
                bool allowDOH,
                struct Curl_dns_entry **entry)
{
  struct Curl_dns_entry *dns = NULL;
  struct Curl_easy *data = conn->data;
  CURLcode result;
  int rc = CURLRESOLV_ERROR; /* default to failure */

  *entry = NULL;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  dns = fetch_addr(conn, hostname, port);

  if(dns) {
    infof(data, "Hostname %s was found in DNS cache\n", hostname);
    dns->inuse++; /* we use it! */
    rc = CURLRESOLV_RESOLVED;
  }

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

  if(!dns) {
    /* The entry was not in the cache. Resolve it to IP address */

    Curl_addrinfo *addr;
    int respwait = 0;

    /* Check what IP specifics the app has requested and if we can provide it.
     * If not, bail out. */
    if(!Curl_ipvalid(conn))
      return CURLRESOLV_ERROR;

    /* notify the resolver start callback */
    if(data->set.resolver_start) {
      int st;
      Curl_set_in_callback(data, true);
      st = data->set.resolver_start(data->state.resolver, NULL,
                                    data->set.resolver_start_client);
      Curl_set_in_callback(data, false);
      if(st)
        return CURLRESOLV_ERROR;
    }

    if(allowDOH && data->set.doh) {
      addr = Curl_doh(conn, hostname, port, &respwait);
    }
    else {
      /* If Curl_getaddrinfo() returns NULL, 'respwait' might be set to a
         non-zero value indicating that we need to wait for the response to the
         resolve call */
      addr = Curl_getaddrinfo(conn,
#ifdef DEBUGBUILD
                              (data->set.str[STRING_DEVICE]
                               && !strcmp(data->set.str[STRING_DEVICE],
                                          "LocalHost"))?"localhost":
#endif
                              hostname, port, &respwait);
    }
    if(!addr) {
      if(respwait) {
        /* the response to our resolve call will come asynchronously at
           a later time, good or bad */
        /* First, check that we haven't received the info by now */
        result = Curl_resolv_check(conn, &dns);
        if(result) /* error detected */
          return CURLRESOLV_ERROR;
        if(dns)
          rc = CURLRESOLV_RESOLVED; /* pointer provided */
        else
          rc = CURLRESOLV_PENDING; /* no info yet */
      }
    }
    else {
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, addr, hostname, port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(addr);
      else
        rc = CURLRESOLV_RESOLVED;
    }
  }

  *entry = dns;

  return rc;
}